

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perftest.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  int rv;
  int in_stack_000000b0;
  int local_4;
  
  uVar1 = num_docs();
  printf("-- speed tests determine parsing throughput given %d different sample documents --\n",
         (ulong)uVar1);
  printf("With UTF8 validation:\n");
  local_4 = run(in_stack_000000b0);
  if (local_4 == 0) {
    printf("Without UTF8 validation:\n");
    local_4 = run(in_stack_000000b0);
  }
  return local_4;
}

Assistant:

int
main(void)
{
    int rv = 0;

    printf("-- speed tests determine parsing throughput given %d different sample documents --\n",
           num_docs());

    printf("With UTF8 validation:\n");
    rv = run(1);
    if (rv != 0) return rv;
    printf("Without UTF8 validation:\n");
    rv = run(0);
    return rv;
}